

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_69d49b::HandleConvertCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pcVar2;
  ushort uVar3;
  NormalizeOption NVar4;
  int iVar5;
  size_type __rlen;
  char *pcVar6;
  pointer pbVar7;
  bool fmt;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view separator;
  string_view value_00;
  string_view arg;
  string value;
  allocator<char> local_119;
  undefined1 local_118 [32];
  _List local_f8;
  char *local_f0;
  undefined1 local_e8 [16];
  pointer local_d8;
  path local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  pointer local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (((long)(args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 6U <
      0xfffffffffffffffe) {
    local_118._0_8_ = local_118 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_118,"CONVERT must be called with three or four arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_00237de2;
  }
  pcVar6 = pbVar1[2]._M_dataplus._M_p;
  pbVar7 = (pointer)pbVar1[2]._M_string_length;
  if (pbVar7 == (pointer)0x13) {
    auVar13[0] = -(pcVar6[3] == 'N');
    auVar13[1] = -(pcVar6[4] == 'A');
    auVar13[2] = -(pcVar6[5] == 'T');
    auVar13[3] = -(pcVar6[6] == 'I');
    auVar13[4] = -(pcVar6[7] == 'V');
    auVar13[5] = -(pcVar6[8] == 'E');
    auVar13[6] = -(pcVar6[9] == '_');
    auVar13[7] = -(pcVar6[10] == 'P');
    auVar13[8] = -(pcVar6[0xb] == 'A');
    auVar13[9] = -(pcVar6[0xc] == 'T');
    auVar13[10] = -(pcVar6[0xd] == 'H');
    auVar13[0xb] = -(pcVar6[0xe] == '_');
    auVar13[0xc] = -(pcVar6[0xf] == 'L');
    auVar13[0xd] = -(pcVar6[0x10] == 'I');
    auVar13[0xe] = -(pcVar6[0x11] == 'S');
    auVar13[0xf] = -(pcVar6[0x12] == 'T');
    auVar9[0] = -(*pcVar6 == 'T');
    auVar9[1] = -(pcVar6[1] == 'O');
    auVar9[2] = -(pcVar6[2] == '_');
    auVar9[3] = -(pcVar6[3] == 'N');
    auVar9[4] = -(pcVar6[4] == 'A');
    auVar9[5] = -(pcVar6[5] == 'T');
    auVar9[6] = -(pcVar6[6] == 'I');
    auVar9[7] = -(pcVar6[7] == 'V');
    auVar9[8] = -(pcVar6[8] == 'E');
    auVar9[9] = -(pcVar6[9] == '_');
    auVar9[10] = -(pcVar6[10] == 'P');
    auVar9[0xb] = -(pcVar6[0xb] == 'A');
    auVar9[0xc] = -(pcVar6[0xc] == 'T');
    auVar9[0xd] = -(pcVar6[0xd] == 'H');
    auVar9[0xe] = -(pcVar6[0xe] == '_');
    auVar9[0xf] = -(pcVar6[0xf] == 'L');
    auVar9 = auVar9 & auVar13;
    uVar3 = (ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar9[0xf] >> 7) << 0xf;
LAB_00237e5a:
    if (uVar3 == 0xffff) {
      if (pbVar1[3]._M_string_length == 0) {
        local_118._0_8_ = local_118 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_118,"Invalid name for output variable.","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else {
        if (((anonymous_namespace)::
             HandleConvertCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
             ::parser == '\0') &&
           (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                         HandleConvertCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                         ::parser), iVar5 != 0)) {
          NormalizeParser::NormalizeParser(&HandleConvertCommand::parser);
          __cxa_atexit(CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>::
                       ~CMakePathArgumentParser,&HandleConvertCommand::parser,&__dso_handle);
          __cxa_guard_release(&(anonymous_namespace)::
                               HandleConvertCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                               ::parser);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_at_end(&HandleConvertCommand::parser.
                           super_CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>.
                           Inputs,HandleConvertCommand::parser.
                                  super_CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>
                                  .Inputs.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
        local_118._8_8_ =
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        local_118._0_8_ =
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 4;
        NVar4 = cmArgumentParser<(anonymous_namespace)::NormalizeOption>::
                Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                          ((cmArgumentParser<(anonymous_namespace)::NormalizeOption> *)
                           &HandleConvertCommand::parser,
                           (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)local_118,
                           &HandleConvertCommand::parser.
                            super_CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>.
                            Inputs,local_118._8_8_);
        if (HandleConvertCommand::parser.
            super_CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>.Inputs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            HandleConvertCommand::parser.
            super_CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>.Inputs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_e8 = (undefined1  [16])0x0;
          local_d8 = (pointer)0x0;
          local_68 = 0x454b414d435f4f54;
          uStack_60 = 0;
          local_78 = 0x494c5f485441505f;
          uStack_70 = 0;
          if (pbVar1[2]._M_string_length == 0x12) {
            pcVar6 = pbVar1[2]._M_dataplus._M_p;
            auVar18[0] = -((char)*(undefined2 *)(pcVar6 + 0x10) == 'S');
            auVar18[1] = -((char)((ushort)*(undefined2 *)(pcVar6 + 0x10) >> 8) == 'T');
            auVar18[2] = 0xff;
            auVar18[3] = 0xff;
            auVar18[4] = 0xff;
            auVar18[5] = 0xff;
            auVar18[6] = 0xff;
            auVar18[7] = 0xff;
            auVar18[8] = 0xff;
            auVar18[9] = 0xff;
            auVar18[10] = 0xff;
            auVar18[0xb] = 0xff;
            auVar18[0xc] = 0xff;
            auVar18[0xd] = 0xff;
            auVar18[0xe] = 0xff;
            auVar18[0xf] = 0xff;
            auVar14[0] = -(*pcVar6 == 'T');
            auVar14[1] = -(pcVar6[1] == 'O');
            auVar14[2] = -(pcVar6[2] == '_');
            auVar14[3] = -(pcVar6[3] == 'C');
            auVar14[4] = -(pcVar6[4] == 'M');
            auVar14[5] = -(pcVar6[5] == 'A');
            auVar14[6] = -(pcVar6[6] == 'K');
            auVar14[7] = -(pcVar6[7] == 'E');
            auVar14[8] = -(pcVar6[8] == '_');
            auVar14[9] = -(pcVar6[9] == 'P');
            auVar14[10] = -(pcVar6[10] == 'A');
            auVar14[0xb] = -(pcVar6[0xb] == 'T');
            auVar14[0xc] = -(pcVar6[0xc] == 'H');
            auVar14[0xd] = -(pcVar6[0xd] == '_');
            auVar14[0xe] = -(pcVar6[0xe] == 'L');
            auVar14[0xf] = -(pcVar6[0xf] == 'I');
            auVar18 = auVar18 & auVar14;
            if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00238053;
            cmsys::SystemTools::SplitString
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_c8,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1,':',false);
            local_118._16_8_ = local_d8;
            local_d8 = (pointer)local_c8._M_pathname.field_2._M_allocated_capacity;
            local_118._0_8_ = local_e8._0_8_;
            local_118._8_8_ = local_e8._8_8_;
            local_e8._0_8_ = local_c8._M_pathname._M_dataplus._M_p;
            local_e8._8_8_ = local_c8._M_pathname._M_string_length;
            local_c8._M_pathname._M_dataplus._M_p = (pointer)0x0;
            local_c8._M_pathname._M_string_length = 0;
            local_c8._M_pathname.field_2._M_allocated_capacity = 0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_118);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_c8);
          }
          else {
LAB_00238053:
            pbVar7 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            arg._M_str = pbVar7[1]._M_dataplus._M_p;
            arg._M_len = pbVar7[1]._M_string_length;
            cmExpandList(arg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_e8,false);
          }
          local_50 = (pointer)local_e8._8_8_;
          if (local_e8._0_8_ != local_e8._8_8_) {
            local_48 = local_68;
            uStack_40 = local_78;
            pbVar7 = (pointer)local_e8._0_8_;
            do {
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              pcVar2 = (pbVar7->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_98,pcVar2,pcVar2 + pbVar7->_M_string_length);
              fmt = true;
              if (pbVar1[2]._M_string_length == 0x12) {
                pcVar6 = pbVar1[2]._M_dataplus._M_p;
                auVar10[0] = -(*pcVar6 == (char)local_48);
                auVar10[1] = -(pcVar6[1] == local_48._1_1_);
                auVar10[2] = -(pcVar6[2] == local_48._2_1_);
                auVar10[3] = -(pcVar6[3] == local_48._3_1_);
                auVar10[4] = -(pcVar6[4] == local_48._4_1_);
                auVar10[5] = -(pcVar6[5] == local_48._5_1_);
                auVar10[6] = -(pcVar6[6] == local_48._6_1_);
                auVar10[7] = -(pcVar6[7] == local_48._7_1_);
                auVar10[8] = -(pcVar6[8] == (char)uStack_40);
                auVar10[9] = -(pcVar6[9] == uStack_40._1_1_);
                auVar10[10] = -(pcVar6[10] == uStack_40._2_1_);
                auVar10[0xb] = -(pcVar6[0xb] == uStack_40._3_1_);
                auVar10[0xc] = -(pcVar6[0xc] == uStack_40._4_1_);
                auVar10[0xd] = -(pcVar6[0xd] == uStack_40._5_1_);
                auVar10[0xe] = -(pcVar6[0xe] == uStack_40._6_1_);
                auVar10[0xf] = -(pcVar6[0xf] == uStack_40._7_1_);
                auVar15[0] = -((char)*(undefined2 *)(pcVar6 + 0x10) == 'S');
                auVar15[1] = -((char)((ushort)*(undefined2 *)(pcVar6 + 0x10) >> 8) == 'T');
                auVar15[2] = 0xff;
                auVar15[3] = 0xff;
                auVar15[4] = 0xff;
                auVar15[5] = 0xff;
                auVar15[6] = 0xff;
                auVar15[7] = 0xff;
                auVar15[8] = 0xff;
                auVar15[9] = 0xff;
                auVar15[10] = 0xff;
                auVar15[0xb] = 0xff;
                auVar15[0xc] = 0xff;
                auVar15[0xd] = 0xff;
                auVar15[0xe] = 0xff;
                auVar15[0xf] = 0xff;
                auVar15 = auVar15 & auVar10;
                fmt = (ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) != 0xffff;
              }
              cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                        ((cmCMakePath *)local_118,&local_98,fmt);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
              if ((NVar4.Normalize & 1U) != 0) {
                cmCMakePath::Normal((cmCMakePath *)&local_c8,(cmCMakePath *)local_118);
                cmCMakePath::operator=((cmCMakePath *)local_118,(cmCMakePath *)&local_c8);
                std::filesystem::__cxx11::path::~path(&local_c8);
              }
              if (pbVar1[2]._M_string_length == 0x12) {
                pcVar6 = pbVar1[2]._M_dataplus._M_p;
                auVar11[0] = -(*pcVar6 == (char)local_48);
                auVar11[1] = -(pcVar6[1] == local_48._1_1_);
                auVar11[2] = -(pcVar6[2] == local_48._2_1_);
                auVar11[3] = -(pcVar6[3] == local_48._3_1_);
                auVar11[4] = -(pcVar6[4] == local_48._4_1_);
                auVar11[5] = -(pcVar6[5] == local_48._5_1_);
                auVar11[6] = -(pcVar6[6] == local_48._6_1_);
                auVar11[7] = -(pcVar6[7] == local_48._7_1_);
                auVar11[8] = -(pcVar6[8] == (char)uStack_40);
                auVar11[9] = -(pcVar6[9] == uStack_40._1_1_);
                auVar11[10] = -(pcVar6[10] == uStack_40._2_1_);
                auVar11[0xb] = -(pcVar6[0xb] == uStack_40._3_1_);
                auVar11[0xc] = -(pcVar6[0xc] == uStack_40._4_1_);
                auVar11[0xd] = -(pcVar6[0xd] == uStack_40._5_1_);
                auVar11[0xe] = -(pcVar6[0xe] == uStack_40._6_1_);
                auVar11[0xf] = -(pcVar6[0xf] == uStack_40._7_1_);
                auVar16[0] = -((char)*(undefined2 *)(pcVar6 + 0x10) == 'S');
                auVar16[1] = -((char)((ushort)*(undefined2 *)(pcVar6 + 0x10) >> 8) == 'T');
                auVar16[2] = 0xff;
                auVar16[3] = 0xff;
                auVar16[4] = 0xff;
                auVar16[5] = 0xff;
                auVar16[6] = 0xff;
                auVar16[7] = 0xff;
                auVar16[8] = 0xff;
                auVar16[9] = 0xff;
                auVar16[10] = 0xff;
                auVar16[0xb] = 0xff;
                auVar16[0xc] = 0xff;
                auVar16[0xd] = 0xff;
                auVar16[0xe] = 0xff;
                auVar16[0xf] = 0xff;
                auVar16 = auVar16 & auVar11;
                if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) != 0xffff) goto LAB_002381a3;
                std::filesystem::__cxx11::path::
                generic_string<char,std::char_traits<char>,std::allocator<char>>
                          (&local_c8._M_pathname,(path *)local_118,&local_119);
              }
              else {
LAB_002381a3:
                cmCMakePath::NativeString_abi_cxx11_(&local_c8._M_pathname,(cmCMakePath *)local_118)
                ;
              }
              std::__cxx11::string::operator=((string *)pbVar7,(string *)&local_c8);
              if (local_c8._M_pathname._M_dataplus._M_p != (undefined1 *)((long)&local_c8 + 0x10U))
              {
                operator_delete(local_c8._M_pathname._M_dataplus._M_p,
                                local_c8._M_pathname.field_2._M_allocated_capacity + 1);
              }
              std::filesystem::__cxx11::path::~path((path *)local_118);
              pbVar7 = pbVar7 + 1;
            } while (pbVar7 != local_50);
          }
          if (pbVar1[2]._M_string_length == 0x12) {
            pcVar6 = pbVar1[2]._M_dataplus._M_p;
            auVar17[0] = -((char)*(undefined2 *)(pcVar6 + 0x10) == 'S');
            auVar17[1] = -((char)((ushort)*(undefined2 *)(pcVar6 + 0x10) >> 8) == 'T');
            auVar17[2] = 0xff;
            auVar17[3] = 0xff;
            auVar17[4] = 0xff;
            auVar17[5] = 0xff;
            auVar17[6] = 0xff;
            auVar17[7] = 0xff;
            auVar17[8] = 0xff;
            auVar17[9] = 0xff;
            auVar17[10] = 0xff;
            auVar17[0xb] = 0xff;
            auVar17[0xc] = 0xff;
            auVar17[0xd] = 0xff;
            auVar17[0xe] = 0xff;
            auVar17[0xf] = 0xff;
            auVar19[0] = -((char)local_68 == *pcVar6);
            auVar19[1] = -(local_68._1_1_ == pcVar6[1]);
            auVar19[2] = -(local_68._2_1_ == pcVar6[2]);
            auVar19[3] = -(local_68._3_1_ == pcVar6[3]);
            auVar19[4] = -(local_68._4_1_ == pcVar6[4]);
            auVar19[5] = -(local_68._5_1_ == pcVar6[5]);
            auVar19[6] = -(local_68._6_1_ == pcVar6[6]);
            auVar19[7] = -(local_68._7_1_ == pcVar6[7]);
            auVar19[8] = -((char)local_78 == pcVar6[8]);
            auVar19[9] = -((char)((ulong)local_78 >> 8) == pcVar6[9]);
            auVar19[10] = -((char)((ulong)local_78 >> 0x10) == pcVar6[10]);
            auVar19[0xb] = -((char)((ulong)local_78 >> 0x18) == pcVar6[0xb]);
            auVar19[0xc] = -((char)((ulong)local_78 >> 0x20) == pcVar6[0xc]);
            auVar19[0xd] = -((char)((ulong)local_78 >> 0x28) == pcVar6[0xd]);
            auVar19[0xe] = -((char)((ulong)local_78 >> 0x30) == pcVar6[0xe]);
            auVar19[0xf] = -((char)((ulong)local_78 >> 0x38) == pcVar6[0xf]);
            auVar17 = auVar17 & auVar19;
            if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff) {
              pcVar6 = ";";
              goto LAB_00238254;
            }
          }
          pcVar6 = ":";
LAB_00238254:
          separator._M_str = pcVar6;
          separator._M_len = 1;
          cmJoin((string *)local_118,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_e8,separator,(string_view)ZEXT816(0));
          value_00._M_str = (char *)local_118._0_8_;
          value_00._M_len = local_118._8_8_;
          cmMakefile::AddDefinition
                    (status->Makefile,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + 3,value_00);
          if ((pointer)local_118._0_8_ != (pointer)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_e8);
          return true;
        }
        local_118._0_8_ = local_118 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_118,"CONVERT called with unexpected arguments.","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
LAB_00237de2:
      local_c8._M_pathname.field_2._M_allocated_capacity = local_118._16_8_;
      local_c8._M_pathname._M_dataplus._M_p = (pointer)local_118._0_8_;
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118._0_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_118 + 0x10)) {
        return false;
      }
      goto LAB_00237ecc;
    }
  }
  else if (pbVar7 == (pointer)0x12) {
    auVar8[0] = -(*pcVar6 == 'T');
    auVar8[1] = -(pcVar6[1] == 'O');
    auVar8[2] = -(pcVar6[2] == '_');
    auVar8[3] = -(pcVar6[3] == 'C');
    auVar8[4] = -(pcVar6[4] == 'M');
    auVar8[5] = -(pcVar6[5] == 'A');
    auVar8[6] = -(pcVar6[6] == 'K');
    auVar8[7] = -(pcVar6[7] == 'E');
    auVar8[8] = -(pcVar6[8] == '_');
    auVar8[9] = -(pcVar6[9] == 'P');
    auVar8[10] = -(pcVar6[10] == 'A');
    auVar8[0xb] = -(pcVar6[0xb] == 'T');
    auVar8[0xc] = -(pcVar6[0xc] == 'H');
    auVar8[0xd] = -(pcVar6[0xd] == '_');
    auVar8[0xe] = -(pcVar6[0xe] == 'L');
    auVar8[0xf] = -(pcVar6[0xf] == 'I');
    auVar12[0] = -((char)*(undefined2 *)(pcVar6 + 0x10) == 'S');
    auVar12[1] = -((char)((ushort)*(undefined2 *)(pcVar6 + 0x10) >> 8) == 'T');
    auVar12[2] = 0xff;
    auVar12[3] = 0xff;
    auVar12[4] = 0xff;
    auVar12[5] = 0xff;
    auVar12[6] = 0xff;
    auVar12[7] = 0xff;
    auVar12[8] = 0xff;
    auVar12[9] = 0xff;
    auVar12[10] = 0xff;
    auVar12[0xb] = 0xff;
    auVar12[0xc] = 0xff;
    auVar12[0xd] = 0xff;
    auVar12[0xe] = 0xff;
    auVar12[0xf] = 0xff;
    auVar12 = auVar12 & auVar8;
    uVar3 = (ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
            (ushort)(byte)(auVar12[0xf] >> 7) << 0xf;
    goto LAB_00237e5a;
  }
  local_118._0_8_ = &DAT_00000027;
  local_118._8_8_ = "CONVERT called with an unknown action: ";
  local_f8._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x1;
  local_f0 = ".";
  views._M_len = 3;
  views._M_array = (iterator)local_118;
  local_118._16_8_ = pbVar7;
  local_118._24_8_ = pcVar6;
  cmCatViews_abi_cxx11_(&local_c8._M_pathname,views);
  std::__cxx11::string::_M_assign((string *)&status->Error);
  if (local_c8._M_pathname._M_dataplus._M_p == (undefined1 *)((long)&local_c8 + 0x10U)) {
    return false;
  }
LAB_00237ecc:
  operator_delete(local_c8._M_pathname._M_dataplus._M_p,
                  (ulong)((long)&(((pointer)local_c8._M_pathname.field_2._M_allocated_capacity)->
                                 _M_dataplus)._M_p + 1));
  return false;
}

Assistant:

bool HandleConvertCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  const auto pathSep = ";"_s;
#else
  const auto pathSep = ":"_s;
#endif
  const auto cmakePath = "TO_CMAKE_PATH_LIST"_s;
  const auto nativePath = "TO_NATIVE_PATH_LIST"_s;

  if (args.size() < 4 || args.size() > 5) {
    status.SetError("CONVERT must be called with three or four arguments.");
    return false;
  }

  const auto& action = args[2];

  if (action != cmakePath && action != nativePath) {
    status.SetError(
      cmStrCat("CONVERT called with an unknown action: ", action, "."));
    return false;
  }

  if (args[3].empty()) {
    status.SetError("Invalid name for output variable.");
    return false;
  }

  static NormalizeParser const parser;

  const auto arguments = parser.Parse<4>(args);

  if (!parser.GetInputs().empty()) {
    status.SetError("CONVERT called with unexpected arguments.");
    return false;
  }

  std::vector<std::string> paths;

  if (action == cmakePath) {
    paths = cmSystemTools::SplitString(args[1], pathSep.front());
  } else {
    cmExpandList(args[1], paths);
  }

  for (auto& path : paths) {
    auto p = cmCMakePath(path,
                         action == cmakePath ? cmCMakePath::native_format
                                             : cmCMakePath::generic_format);
    if (arguments.Normalize) {
      p = p.Normal();
    }
    if (action == cmakePath) {
      path = p.GenericString();
    } else {
      path = p.NativeString();
    }
  }

  auto value = cmJoin(paths, action == cmakePath ? ";"_s : pathSep);
  status.GetMakefile().AddDefinition(args[3], value);

  return true;
}